

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

level_info_t * __thiscall
FMapInfoParser::ParseMapHeader(FMapInfoParser *this,level_info_t *defaultinfo)

{
  FString *this_00;
  byte *pbVar1;
  ulong uVar2;
  Node *pNVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  Node *pNVar8;
  level_info_t *this_01;
  char *pcVar9;
  char maptemp [8];
  char local_30 [8];
  
  bVar4 = FScanner::CheckNumber(&this->sc);
  if (bVar4) {
    mysnprintf(local_30,8,"MAP%02d",(ulong)(uint)(this->sc).Number);
    iVar5 = FName::NameManager::FindName(&FName::NameData,local_30,false);
    this->HexenHack = true;
  }
  else {
    FScanner::MustGetString(&this->sc);
    iVar5 = FName::NameManager::FindName(&FName::NameData,(this->sc).String,false);
  }
  uVar6 = FindWadLevelInfo(FName::NameData.NameArray[iVar5].Text);
  if (uVar6 == 0xffffffff) {
    uVar6 = TArray<level_info_t,_level_info_t>::Reserve(&wadlevelinfos,1);
  }
  this_01 = wadlevelinfos.Array + (int)uVar6;
  level_info_t::operator=(this_01,defaultinfo);
  if (this->HexenHack == true) {
    this_01->WallVertLight = '\0';
    this_01->WallHorizLight = '\0';
    uVar2._0_4_ = this_01->flags;
    uVar2._4_4_ = this_01->flags2;
    this_01->flags = (int)(uVar2 | 0x81011000081801);
    this_01->flags2 = (int)((uVar2 | 0x81011000081801) >> 0x20);
  }
  this_00 = &this_01->MapName;
  FString::operator=(this_00,FName::NameData.NameArray[iVar5].Text);
  FString::ToUpper(this_00);
  FScanner::MustGetString(&this->sc);
  pcVar9 = (this->sc).String;
  if (*pcVar9 == '$') {
    pbVar1 = (byte *)((long)&this_01->flags + 3);
    *pbVar1 = *pbVar1 | 4;
    pcVar9 = pcVar9 + 1;
  }
  else {
    bVar4 = FScanner::Compare(&this->sc,"lookup");
    if (bVar4) {
      FScanner::MustGetString(&this->sc);
      pbVar1 = (byte *)((long)&this_01->flags + 3);
      *pbVar1 = *pbVar1 | 4;
    }
    pcVar9 = (this->sc).String;
  }
  FString::operator=(&this_01->LevelName,pcVar9);
  pcVar9 = this_00->Chars;
  iVar5 = strncasecmp(pcVar9,"MAP",3);
  if ((iVar5 == 0) && (sVar7 = strlen(pcVar9), sVar7 < 6)) {
    uVar6 = atoi(pcVar9 + 3);
    if (0xffffff9c < uVar6 - 100) goto LAB_004e3357;
  }
  else if ((*pcVar9 == 'E') &&
          ((((byte)(pcVar9[1] - 0x30U) < 10 && (pcVar9[2] == 'M')) &&
           ((byte)(pcVar9[3] - 0x30U) < 10)))) {
    uVar6 = ((uint)(byte)(pcVar9[3] - 0x30U) + pcVar9[1] * 10) - 0x1ea;
    goto LAB_004e3357;
  }
  uVar6 = 0;
LAB_004e3357:
  this_01->levelnum = uVar6;
  pNVar3 = HexenMusic.Nodes + (HexenMusic.Size - 1 & uVar6);
  while( true ) {
    pNVar8 = pNVar3;
    if (pNVar8 == (Node *)0x0) {
      return this_01;
    }
    if (pNVar8->Next == (Node *)0x1) break;
    pNVar3 = pNVar8->Next;
    if ((pNVar8->Pair).Key == uVar6) {
      FString::operator=(&this_01->Music,&(pNVar8->Pair).Value);
      return this_01;
    }
  }
  return this_01;
}

Assistant:

level_info_t *FMapInfoParser::ParseMapHeader(level_info_t &defaultinfo)
{
	FName mapname;

	if (sc.CheckNumber())
	{	// MAPNAME is a number; assume a Hexen wad
		char maptemp[8];
		mysnprintf (maptemp, countof(maptemp), "MAP%02d", sc.Number);
		mapname = maptemp;
		HexenHack = true;
	}
	else 
	{
		sc.MustGetString();
		mapname = sc.String;
	}
	int levelindex = FindWadLevelInfo (mapname);
	if (levelindex == -1)
	{
		levelindex = wadlevelinfos.Reserve(1);
	}
	level_info_t *levelinfo = &wadlevelinfos[levelindex];
	*levelinfo = defaultinfo;
	if (HexenHack)
	{
		levelinfo->WallHorizLight = levelinfo->WallVertLight = 0;

		// Hexen levels are automatically nointermission,
		// no auto sound sequences, falling damage,
		// monsters activate their own specials, and missiles
		// are always the activators of impact lines.
		levelinfo->flags |= LEVEL_NOINTERMISSION
						 | LEVEL_SNDSEQTOTALCTRL
						 | LEVEL_FALLDMG_HX
						 | LEVEL_ACTOWNSPECIAL;
		levelinfo->flags2|= LEVEL2_HEXENHACK
						 | LEVEL2_INFINITE_FLIGHT
						 | LEVEL2_MISSILESACTIVATEIMPACT
						 | LEVEL2_MONSTERFALLINGDAMAGE;

	}

	levelinfo->MapName = mapname;
	levelinfo->MapName.ToUpper();
	sc.MustGetString ();
	if (sc.String[0] == '$')
	{
		// For consistency with other definitions allow $Stringtablename here, too.
		levelinfo->flags |= LEVEL_LOOKUPLEVELNAME;
		levelinfo->LevelName = sc.String + 1;
	}
	else
	{
		if (sc.Compare ("lookup"))
		{
			sc.MustGetString ();
			levelinfo->flags |= LEVEL_LOOKUPLEVELNAME;
		}
		levelinfo->LevelName = sc.String;
	}

	// Set up levelnum now so that you can use Teleport_NewMap specials
	// to teleport to maps with standard names without needing a levelnum.
	levelinfo->levelnum = GetDefaultLevelNum(levelinfo->MapName);

	// Does this map have a song defined via SNDINFO's $map command?
	// Set that as this map's default music if it does.
	FString *song;
	if ((song = HexenMusic.CheckKey(levelinfo->levelnum)) != NULL)
	{
		levelinfo->Music = *song;
	}

	return levelinfo;
}